

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

bool __thiscall QTabBar::event(QTabBar *this,QEvent *event)

{
  undefined1 *rect;
  ushort uVar1;
  QTabBarPrivate *this_00;
  Tab *pTVar2;
  char cVar3;
  bool bVar4;
  uint index;
  int iVar5;
  QPoint QVar6;
  QStyle *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  QPointF QVar9;
  QRect QVar10;
  QPoint local_50;
  qreal local_48;
  qreal qStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  switch(uVar1) {
  case 0x7b:
    iVar5 = QTabBarPrivate::indexAtPos(this_00,(QPoint *)(event + 0x10));
    if ((((ulong)(long)iVar5 < (ulong)(this_00->tabList).d.size) &&
        (pTVar2 = (this_00->tabList).d.ptr[iVar5], pTVar2 != (Tab *)0x0)) &&
       (bVar4 = true, (pTVar2->whatsThis).d.size != 0)) goto LAB_00450a41;
    event[0xc] = (QEvent)0x0;
    break;
  case 0x7c:
  case 0x7d:
  case 0x7e:
    goto switchD_00450716_caseD_7c;
  case 0x7f:
  case 0x81:
    QVar9 = QSinglePointEvent::position((QSinglePointEvent *)event);
    qStack_40 = QVar9.yp;
    local_48 = QVar9.xp;
    QVar6 = QPointF::toPoint((QPointF *)&local_48);
    this_00->mousePosition = QVar6;
    rect = &(this_00->super_QWidgetPrivate).field_0x254;
    cVar3 = QRect::contains((QPoint *)rect,SUB81(&this_00->mousePosition,0));
    bVar4 = true;
    if (cVar3 == '\0') {
      if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c) &&
         (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
        QWidget::update(&this->super_QWidget,(QRect *)rect);
      }
      index = tabAt(this,&this_00->mousePosition);
      this_00->hoverIndex = index;
      if (((int)index < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)index)) {
        *(undefined8 *)rect = 0;
        *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
      }
      else {
        QVar10 = tabRect(this,index);
        *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar10;
        QWidget::update(&this->super_QWidget,(QRect *)rect);
      }
    }
    goto LAB_00450a41;
  case 0x80:
    (this_00->mousePosition).xp = -1;
    (this_00->mousePosition).yp = -1;
    if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c) &&
       (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
      QWidget::update(&this->super_QWidget,(QRect *)&(this_00->super_QWidgetPrivate).field_0x254);
    }
    this_00->hoverIndex = -1;
    *(undefined8 *)&(this_00->super_QWidgetPrivate).field_0x254 = 0;
    *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
    (this_00->accumulatedAngleDelta).xp = 0;
    (this_00->accumulatedAngleDelta).yp = 0;
    break;
  default:
    if (uVar1 - 2 < 2) {
LAB_004507dd:
      QVar9 = QSinglePointEvent::position((QSinglePointEvent *)event);
      qStack_40 = QVar9.yp;
      local_48 = QVar9.xp;
      QVar6 = QPointF::toPoint((QPointF *)&local_48);
      this_00->mousePosition = QVar6;
      (this_00->mouseButtons).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
      super_QFlagsStorage<Qt::MouseButton>.i = *(Int *)(event + 0x44);
    }
    else if (uVar1 - 0x3e < 2) {
      QTabBarPrivate::killSwitchTabTimer(this_00);
LAB_00450814:
      event[0xc] = (QEvent)0x0;
    }
    else {
      if (uVar1 == 5) goto LAB_004507dd;
      if (uVar1 == 0x3c) {
        if ((this_00->field_0x2d1 & 0x10) != 0) {
          event[0xc] = (QEvent)0x1;
        }
      }
      else if (uVar1 == 0x3d) {
        if ((this_00->field_0x2d1 & 0x10) != 0) {
          local_48 = *(qreal *)(event + 0x10);
          qStack_40 = *(qreal *)(event + 0x18);
          local_50 = QPointF::toPoint((QPointF *)&local_48);
          iVar5 = tabAt(this,&local_50);
          bVar4 = isTabEnabled(this,iVar5);
          if ((bVar4) && (this_00->switchTabCurrentIndex != iVar5)) {
            this_00->switchTabCurrentIndex = iVar5;
            pQVar7 = QWidget::style(&this->super_QWidget);
            iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x68,0,this,0);
            QBasicTimer::start(&this_00->switchTabTimer,(Duration)((long)iVar5 * 1000000),
                               (QObject *)this);
          }
          goto LAB_00450814;
        }
      }
      else if (uVar1 == 0x6e) {
        iVar5 = tabAt(this,(QPoint *)(event + 0x10));
        if ((((ulong)(long)iVar5 < (ulong)(this_00->tabList).d.size) &&
            (pTVar2 = (this_00->tabList).d.ptr[iVar5], pTVar2 != (Tab *)0x0)) &&
           ((pTVar2->toolTip).d.size != 0)) {
          local_48 = 0.0;
          qStack_40 = -NAN;
          QToolTip::showText((QPoint *)(event + 0x18),&pTVar2->toolTip,&this->super_QWidget,
                             (QRect *)&local_48,-1);
          break;
        }
      }
      else if (uVar1 == 0x6f) {
        iVar5 = QTabBarPrivate::indexAtPos(this_00,(QPoint *)(event + 0x10));
        if ((((ulong)(long)iVar5 < (ulong)(this_00->tabList).d.size) &&
            (pTVar2 = (this_00->tabList).d.ptr[iVar5], pTVar2 != (Tab *)0x0)) &&
           ((pTVar2->whatsThis).d.size != 0)) {
          QWhatsThis::showText((QPoint *)(event + 0x18),&pTVar2->whatsThis,&this->super_QWidget);
          break;
        }
      }
      else if (uVar1 == 0x75) {
        for (lVar8 = 0; (this_00->tabList).d.size != lVar8; lVar8 = lVar8 + 1) {
          if ((this_00->tabList).d.ptr[lVar8]->shortcutId == *(int *)(event + 0x18)) {
            setCurrentIndex(this,(int)lVar8);
            goto LAB_00450a3e;
          }
        }
      }
    }
    goto switchD_00450716_caseD_7c;
  }
LAB_00450a3e:
  bVar4 = true;
LAB_00450a41:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
switchD_00450716_caseD_7c:
  bVar4 = QWidget::event(&this->super_QWidget,event);
  goto LAB_00450a41;
}

Assistant:

bool QTabBar::event(QEvent *event)
{
    Q_D(QTabBar);
    switch (event->type()) {
    case QEvent::HoverMove:
    case QEvent::HoverEnter: {
        QHoverEvent *he = static_cast<QHoverEvent *>(event);
        d->mousePosition = he->position().toPoint();
        if (!d->hoverRect.contains(d->mousePosition)) {
            if (d->hoverRect.isValid())
                update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        return true;
    }
    case QEvent::HoverLeave: {
        d->mousePosition = {-1, -1};
        if (d->hoverRect.isValid())
            update(d->hoverRect);
        d->hoverIndex = -1;
        d->hoverRect = QRect();
#if QT_CONFIG(wheelevent)
        d->accumulatedAngleDelta = QPoint();
#endif
        return true;
    }
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        if (const QTabBarPrivate::Tab *tab = d->at(tabAt(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->toolTip.isEmpty()) {
                QToolTip::showText(static_cast<QHelpEvent*>(event)->globalPos(), tab->toolTip, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(tooltip)
#if QT_CONFIG(whatsthis)
    case QEvent::QEvent::QueryWhatsThis: {
        const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()));
        if (!tab || tab->whatsThis.isEmpty())
            event->ignore();
        return true;
    }
    case QEvent::WhatsThis:
        if (const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->whatsThis.isEmpty()) {
                QWhatsThis::showText(static_cast<QHelpEvent*>(event)->globalPos(),
                                     tab->whatsThis, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(whatsthis)
#ifndef QT_NO_SHORTCUT

    case QEvent::Shortcut: {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(event);
        for (int i = 0; i < d->tabList.size(); ++i) {
            const QTabBarPrivate::Tab *tab = d->tabList.at(i);
            if (tab->shortcutId == se->shortcutId()) {
                setCurrentIndex(i);
                return true;
            }
        }
    }
        break;
#endif
    case QEvent::Move:
        d->updateMacBorderMetrics();
        break;
#if QT_CONFIG(draganddrop)

    case QEvent::DragEnter:
        if (d->changeCurrentOnDrag)
            event->accept();
        break;
    case QEvent::DragMove:
        if (d->changeCurrentOnDrag) {
            const int tabIndex = tabAt(static_cast<QDragMoveEvent *>(event)->position().toPoint());
            if (isTabEnabled(tabIndex) && d->switchTabCurrentIndex != tabIndex) {
                d->switchTabCurrentIndex = tabIndex;
                d->switchTabTimer.start(
                    style()->styleHint(QStyle::SH_TabBar_ChangeCurrentDelay, nullptr, this) * 1ms, this);
            }
            event->ignore();
        }
        break;
    case QEvent::DragLeave:
    case QEvent::Drop:
        d->killSwitchTabTimer();
        event->ignore();
        break;
#endif
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        d->mousePosition = static_cast<QMouseEvent *>(event)->position().toPoint();
        d->mouseButtons = static_cast<QMouseEvent *>(event)->buttons();
        break;
    default:
        break;
    }

    return QWidget::event(event);
}